

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::init
          (FragmentTextureWorkloadCullCase *this,EVP_PKEY_CTX *ctx)

{
  glBindTextureFunc p_Var1;
  glTexImage2DFunc p_Var2;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  data_00;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  MovePtr *this_00;
  const_reference pvVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_> local_71;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  local_70;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  *local_60;
  allocator<unsigned_char> local_3a;
  value_type_conflict4 local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int size;
  Functions *gl;
  FragmentTextureWorkloadCullCase *this_local;
  Functions *gl_00;
  
  iVar4 = (*((this->super_FragmentWorkloadCullCase).super_RelativeChangeCase.super_BaseCase.
            m_renderCtx)->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar4);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80;
  local_39 = 0xff;
  std::allocator<unsigned_char>::allocator(&local_3a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x10000,&local_39,
             &local_3a);
  std::allocator<unsigned_char>::~allocator(&local_3a);
  this_00 = (MovePtr *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)this_00,gl_00);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>::DefaultDeleter(&local_71);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
             *)&local_70);
  local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,this_00);
  data_00.ptr._4_4_ = in_stack_ffffffffffffff3c;
  data_00.ptr._0_4_ = in_stack_ffffffffffffff38;
  data_00._8_4_ = in_stack_ffffffffffffff40;
  data_00._12_4_ = in_stack_ffffffffffffff44;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::operator=(&this->m_texture,data_00);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
              *)&local_70);
  p_Var1 = gl_00->bindTexture;
  bVar3 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)&this->m_texture);
  (*p_Var1)(0xde1,(uint)bVar3);
  p_Var2 = gl_00->texImage2D;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  (*p_Var2)(0xde1,0,0x8058,0x80,0x80,0,0x1908,0x1401,pvVar5);
  (*gl_00->texParameteri)(0xde1,0x2801,0x2600);
  (*gl_00->texParameteri)(0xde1,0x2800,0x2600);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return extraout_EAX;
}

Assistant:

void FragmentTextureWorkloadCullCase::init (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const int				size	= 128;
	const vector<deUint8>	data	(size*size*4, 255);

	m_texture = MovePtr<glu::Texture>(new glu::Texture(gl));

	gl.bindTexture(GL_TEXTURE_2D, m_texture);
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size, size, 0, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
}